

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::
fastAccessDx(value_type *__return_storage_ptr__,
            FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
            *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_b8;
  value_type local_a8;
  value_type local_88;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_68;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_58;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_48;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_38;
  
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
            (&local_88,&this->left_->fadexpr_,i);
  local_b8.fadexpr_.right_ = &this->right_->val_;
  pFVar1 = (this->right_->dx_).ptr_to_data;
  local_b8.fadexpr_.left_ = &local_88;
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val(&local_a8,&this->left_->fadexpr_);
  local_58.fadexpr_.left_ = pFVar1 + i;
  local_48.fadexpr_.right_ = &local_58;
  local_38.fadexpr_.left_ = &local_48;
  local_68.fadexpr_.left_ = &this->right_->val_;
  local_38.fadexpr_.right_ = &local_68;
  local_68.fadexpr_.right_ = local_68.fadexpr_.left_;
  local_58.fadexpr_.right_ = &local_a8;
  local_48.fadexpr_.left_ = &local_b8;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_38);
  Fad<double>::~Fad(&local_a8);
  Fad<double>::~Fad(&local_88);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}